

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_trim(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  int iVar3;
  ushort **ppuVar4;
  gravity_value_t value_00;
  gravity_value_t value;
  int local_48;
  uint32_t trim_len;
  int32_t i_1;
  int32_t i;
  int32_t index_right;
  int32_t index_left;
  char *s;
  gravity_string_t *src;
  int32_t v;
  int32_t direction;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  src._4_4_ = 0;
  if ((((nargs == 2) && (args[1].isa == gravity_class_int)) &&
      (iVar3 = (int)args[1].field_1.n, -1 < iVar3)) && (iVar3 < 3)) {
    src._4_4_ = iVar3;
  }
  pgVar1 = (args->field_1).p;
  pgVar2 = pgVar1->objclass;
  i = 0;
  i_1 = *(int *)((long)&pgVar1->identifier + 4);
  if ((src._4_4_ == 0) || (src._4_4_ == 1)) {
    trim_len = 0;
    while (((int)trim_len < i_1 &&
           (ppuVar4 = __ctype_b_loc(),
           ((*ppuVar4)[(int)*(char *)((long)&pgVar2->isa + (long)(int)trim_len)] & 0x2000) != 0))) {
      i = i + 1;
      trim_len = trim_len + 1;
    }
  }
  local_48 = i_1;
  if ((src._4_4_ == 0) || (src._4_4_ == 2)) {
    while ((local_48 = local_48 + -1, i <= local_48 &&
           (ppuVar4 = __ctype_b_loc(),
           ((*ppuVar4)[(int)*(char *)((long)&pgVar2->isa + (long)local_48)] & 0x2000) != 0))) {
      i_1 = i_1 + -1;
    }
  }
  value_00 = gravity_string_to_value
                       (vm,(char *)((long)&pgVar2->isa + (long)i),
                        *(int *)((long)&pgVar1->identifier + 4) -
                        (i + (*(int *)((long)&pgVar1->identifier + 4) - i_1)));
  gravity_vm_setslot(vm,value_00,rindex);
  return true;
}

Assistant:

static bool string_trim (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    int32_t direction = 0; // means trim both left and right
    
    // optional second parameters to specify trim-left (1) or trim-right(2)
    // default is trim-both(0)
    if ((nargs == 2) && (VALUE_ISA_INT(GET_VALUE(1)))) {
        int32_t v = (int32_t)VALUE_AS_INT(GET_VALUE(1));
        if (v >= 0 && v <= 2) direction = v;
    }
    
    gravity_string_t *src = VALUE_AS_STRING(GET_VALUE(0));
    const char *s = src->s;
    int32_t index_left = 0;
    int32_t index_right = src->len;
    
    // process left
    if (direction == 0 || direction == 1) {
        for (int32_t i=0; i<index_right; ++i) {
            if (isspace(s[i])) ++index_left;
            else break;
        }
    }
    
    // process right
    if (direction == 0 || direction == 2) {
        for (int32_t i=index_right-1; i>=index_left; --i) {
            if (isspace(s[i])) --index_right;
            else break;
        }
    }
    
    // index_left and index_right now points to the right indexes
    uint32_t trim_len = (index_left - 0) + (src->len - index_right);
    gravity_value_t value = VALUE_FROM_STRING(vm, (const char *)&s[index_left], src->len - trim_len);
    RETURN_VALUE(value, rindex);
}